

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

InterfaceType helics::getMatchType(InterfaceType type)

{
  InterfaceType type_local;
  undefined1 local_1;
  
  if (type == FILTER) {
    local_1 = ENDPOINT;
  }
  else if (type == INPUT) {
    local_1 = PUBLICATION;
  }
  else if (type == PUBLICATION) {
    local_1 = INPUT;
  }
  else {
    local_1 = ENDPOINT;
  }
  return local_1;
}

Assistant:

static InterfaceType getMatchType(InterfaceType type)
{
    switch (type) {
        case InterfaceType::FILTER:
            return InterfaceType::ENDPOINT;
        case InterfaceType::PUBLICATION:
            return InterfaceType::INPUT;
        case InterfaceType::INPUT:
            return InterfaceType::PUBLICATION;
        default:
            return InterfaceType::ENDPOINT;
    }
}